

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn aiGetMaterialFloatArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,ai_real *pOut,uint *pMax)

{
  char *pcVar1;
  Logger *this;
  uint uVar2;
  aiReturn aVar3;
  ulong uVar4;
  bool bVar5;
  allocator local_a1;
  ulong local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  aiMaterialProperty *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (pOut == (ai_real *)0x0) {
    pcVar1 = "pOut != nullptr";
    uVar2 = 99;
  }
  else {
    if (pMat != (aiMaterial *)0x0) {
      aiGetMaterialProperty(pMat,pKey,type,index,&prop);
      aVar3 = aiReturn_FAILURE;
      if (prop != (aiMaterialProperty *)0x0) {
        switch(prop->mType) {
        case aiPTI_Float:
        case aiPTI_Buffer:
          uVar2 = prop->mDataLength >> 2;
          if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
            uVar2 = *pMax;
          }
          for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            pOut[uVar4] = *(ai_real *)(prop->mData + uVar4 * 4);
          }
          break;
        case aiPTI_Double:
          uVar2 = prop->mDataLength >> 3;
          if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
            uVar2 = *pMax;
          }
          for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            pOut[uVar4] = (float)*(double *)(prop->mData + uVar4 * 8);
          }
          break;
        default:
          if (pMax == (uint *)0x0) {
            local_a0 = 0;
          }
          else {
            local_a0 = (ulong)*pMax;
          }
          if (4 < prop->mDataLength) {
            if (prop->mData[prop->mDataLength - 1] != '\0') {
              __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                            ,0x9e,
                            "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                           );
            }
            pcVar1 = prop->mData + 4;
            uVar4 = (ulong)((int)local_a0 - 1);
            while( true ) {
              pcVar1 = Assimp::fast_atoreal_move<float>(pcVar1,pOut,true);
              bVar5 = uVar4 == 0;
              uVar4 = uVar4 - 1;
              if (bVar5) {
                if (pMax == (uint *)0x0) {
                  return aiReturn_SUCCESS;
                }
                *pMax = (uint)local_a0;
                return aiReturn_SUCCESS;
              }
              if ((*pcVar1 != '\t') && (*pcVar1 != ' ')) break;
              pOut = pOut + 1;
            }
            this = Assimp::DefaultLogger::get();
            std::__cxx11::string::string((string *)&local_50,pKey,&local_a1);
            std::operator+(&local_98,"Material property",&local_50);
            std::operator+(&local_78,&local_98,
                           " is a string; failed to parse a float array out of it.");
            Assimp::Logger::error(this,local_78._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_50);
            return aiReturn_FAILURE;
          }
          __assert_fail("prop->mDataLength >= 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                        ,0x9d,
                        "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                       );
        case aiPTI_Integer:
          uVar2 = prop->mDataLength >> 2;
          if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
            uVar2 = *pMax;
          }
          for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            pOut[uVar4] = (float)*(int *)(prop->mData + uVar4 * 4);
          }
        }
        aVar3 = aiReturn_SUCCESS;
        if (pMax != (uint *)0x0) {
          *pMax = uVar2;
        }
      }
      return aVar3;
    }
    pcVar1 = "pMat != nullptr";
    uVar2 = 100;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                ,uVar2,
                "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialFloatArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    ai_real* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != nullptr );
    ai_assert( pMat != nullptr );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index, (const aiMaterialProperty**) &prop);
    if ( nullptr == prop) {
        return AI_FAILURE;
    }

    // data is given in floats, convert to ai_real
    unsigned int iWrite = 0;
    if( aiPTI_Float == prop->mType || aiPTI_Buffer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }

        for (unsigned int a = 0; a < iWrite; ++a) {
            pOut[ a ] = static_cast<ai_real> ( reinterpret_cast<float*>(prop->mData)[a] );
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in doubles, convert to float
    else if( aiPTI_Double == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(double);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<double*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in ints, convert to float
    else if( aiPTI_Integer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(int32_t);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<int32_t*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // a string ... read floats separated by spaces
    else {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur = prop->mData + 4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for ( unsigned int a = 0; ;++a) {
            cur = fast_atoreal_move<ai_real>(cur,pOut[a]);
            if ( a==iWrite-1 ) {
                break;
            }
            if ( !IsSpace(*cur) ) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse a float array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}